

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktx2check.cpp
# Opt level: O3

void sprintf<int,int>(stringstream *oss,string *fmt,int value,int args)

{
  ostream *this;
  ostream *poVar1;
  char cVar2;
  int iVar3;
  pointer pcVar4;
  long lVar5;
  char *__nptr;
  char *__nptr_00;
  bool bVar6;
  char *pcVar7;
  byte bVar8;
  runtime_error *prVar9;
  int *piVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  undefined1 auVar15 [12];
  string local_60;
  int local_40;
  int local_3c;
  char *local_38;
  
  local_40 = value;
  local_3c = args;
  if (fmt->_M_string_length != 0) {
    this = (ostream *)(oss + 0x10);
    uVar14 = 0;
    do {
      pcVar4 = (fmt->_M_dataplus)._M_p;
      cVar2 = pcVar4[uVar14];
      uVar12 = uVar14;
      if ((cVar2 == '%') && (uVar12 = uVar14 + 1, pcVar4[uVar14 + 1] != '%')) {
        uVar14 = std::__cxx11::string::find_first_of((char *)fmt,0x12ed72,uVar12);
        if (uVar14 <= uVar12) {
          bVar6 = false;
          uVar13 = uVar12;
          goto LAB_0011ba7e;
        }
        bVar6 = false;
        goto LAB_0011b9ab;
      }
      local_60._M_dataplus._M_p._0_1_ = cVar2;
      std::__ostream_insert<char,std::char_traits<char>>(this,(char *)&local_60,1);
      uVar14 = uVar12 + 1;
    } while (uVar14 < fmt->_M_string_length);
  }
  prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar9,"extra arguments provided to sprintf");
  __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
LAB_0011b9ab:
  do {
    bVar8 = (fmt->_M_dataplus)._M_p[uVar12];
    uVar13 = uVar12;
    if (bVar8 < 0x2b) {
      if (bVar8 != 0x20) {
        if (bVar8 != 0x23) break;
        bVar6 = true;
      }
    }
    else if (bVar8 == 0x2b) {
      *(uint *)(oss + *(long *)(*(long *)(oss + 0x10) + -0x18) + 0x28) =
           *(uint *)(oss + *(long *)(*(long *)(oss + 0x10) + -0x18) + 0x28) | 0x800;
    }
    else if (bVar8 == 0x2d) {
      *(uint *)(oss + *(long *)(*(long *)(oss + 0x10) + -0x18) + 0x28) =
           *(uint *)(oss + *(long *)(*(long *)(oss + 0x10) + -0x18) + 0x28) & 0xffffff4f | 0x20;
    }
    else {
      if (bVar8 != 0x30) break;
      if (((byte)oss[*(long *)(*(long *)oss + -0x18) + 0x18] & 0x20) == 0) {
        poVar1 = this + *(long *)(*(long *)this + -0x18);
        if (oss[*(long *)(*(long *)this + -0x18) + 0xf1] == (stringstream)0x0) {
          std::ios::widen((char)poVar1);
          poVar1[0xe1] = (ostream)0x1;
        }
        poVar1[0xe0] = (ostream)0x30;
      }
    }
    uVar12 = uVar12 + 1;
    uVar13 = uVar14;
  } while (uVar14 != uVar12);
LAB_0011ba7e:
  std::__cxx11::string::substr((ulong)&local_60,(ulong)fmt);
  __nptr = (char *)CONCAT71(local_60._M_dataplus._M_p._1_7_,(char)local_60._M_dataplus._M_p);
  piVar10 = __errno_location();
  iVar3 = *piVar10;
  *piVar10 = 0;
  lVar11 = strtol(__nptr,&local_38,10);
  pcVar7 = local_38;
  if (local_38 == __nptr) {
    std::__throw_invalid_argument("stoi");
LAB_0011bcc5:
    std::__throw_out_of_range("stoi");
  }
  else {
    if ((lVar11 - 0x80000000U < 0xffffffff00000000) || (*piVar10 == 0x22)) goto LAB_0011bcc5;
    if (*piVar10 == 0) {
      *piVar10 = iVar3;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_60._M_dataplus._M_p._1_7_,(char)local_60._M_dataplus._M_p) !=
        &local_60.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_60._M_dataplus._M_p._1_7_,(char)local_60._M_dataplus._M_p),
                      local_60.field_2._M_allocated_capacity + 1);
    }
    *(long *)(oss + *(long *)(*(long *)this + -0x18) + 0x20) = lVar11;
    bVar8 = pcVar7[(long)((fmt->_M_dataplus)._M_p + (uVar13 - (long)__nptr))];
    if (bVar8 != 0x2e) {
LAB_0011bc12:
      if ((bVar8 | 0x20) == 0x78) {
        lVar11 = *(long *)this;
        lVar5 = *(long *)(lVar11 + -0x18);
        *(uint *)(oss + lVar5 + 0x28) = *(uint *)(oss + lVar5 + 0x28) & 0xffffffb5 | 8;
        if (bVar6) {
          *(uint *)(oss + *(long *)(lVar11 + -0x18) + 0x28) =
               *(uint *)(oss + *(long *)(lVar11 + -0x18) + 0x28) | 0x200;
        }
      }
      std::ostream::operator<<(this,local_40);
      std::__cxx11::string::substr((ulong)&local_60,(ulong)fmt);
      sprintf<int>(oss,&local_60,local_3c);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_60._M_dataplus._M_p._1_7_,(char)local_60._M_dataplus._M_p) !=
          &local_60.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_60._M_dataplus._M_p._1_7_,(char)local_60._M_dataplus._M_p),
                        local_60.field_2._M_allocated_capacity + 1);
      }
      return;
    }
    std::__cxx11::string::substr((ulong)&local_60,(ulong)fmt);
    __nptr_00 = (char *)CONCAT71(local_60._M_dataplus._M_p._1_7_,(char)local_60._M_dataplus._M_p);
    piVar10 = __errno_location();
    iVar3 = *piVar10;
    *piVar10 = 0;
    lVar11 = strtol(__nptr_00,&local_38,10);
    if (local_38 != __nptr_00) {
      if ((0xfffffffeffffffff < lVar11 - 0x80000000U) && (*piVar10 != 0x22)) {
        if (*piVar10 == 0) {
          *piVar10 = iVar3;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_60._M_dataplus._M_p._1_7_,(char)local_60._M_dataplus._M_p) !=
            &local_60.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_60._M_dataplus._M_p._1_7_,(char)local_60._M_dataplus._M_p),
                          local_60.field_2._M_allocated_capacity + 1);
        }
        *(long *)(oss + *(long *)(*(long *)this + -0x18) + 0x18) = lVar11;
        bVar8 = local_38[(long)(pcVar7 + (long)((fmt->_M_dataplus)._M_p +
                                               (((uVar13 - (long)__nptr) + 1) - (long)__nptr_00)))];
        goto LAB_0011bc12;
      }
      goto LAB_0011bcdd;
    }
  }
  std::__throw_invalid_argument("stoi");
LAB_0011bcdd:
  auVar15 = std::__throw_out_of_range("stoi");
  if (auVar15._8_4_ != 1) {
    _Unwind_Resume(auVar15._0_8_);
  }
  __cxa_begin_catch(auVar15._0_8_);
  prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar9,"Expected precision value in sprintf");
  __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void
sprintf(stringstream& oss, const string& fmt, T value, Args ... args)
{
    for (size_t pos = 0; pos < fmt.size(); pos++) {
        if (fmt[pos] == '%' && fmt[++pos] != '%') {
            bool alternateForm = false;
            // Find the format character
            size_t fpos = fmt.find_first_of("diouXxfFeEgGaAcsb", pos);
            for (; pos < fpos; pos++) {
                switch (fmt[pos]) {
                  case '#':
                    alternateForm = true;
                    continue;
                  case '-':
                    oss << left;
                    continue;
                  case '+':
                    oss << showpos;
                    continue;
                  case ' ':
                    continue;
                  case '0':
                    if (!(oss.flags() & oss.left))
                        oss << setfill('0');
                    continue;
                  default:
                    break;
                }
                break;
            }
            try {
                size_t afterpos;
                int width = stoi(fmt.substr(pos, fpos - pos), &afterpos);
                oss << setw(width);
                pos += afterpos;
            } catch (invalid_argument& e) {
                (void)e;
            }
            int precision = 0;
            if (fmt[pos] == '.') try {
                size_t afterpos;
                ++pos;
                precision = stoi(fmt.substr(pos, fpos - pos), &afterpos);
                if (!std::is_same<T, const char*>::value) {
                     oss << setprecision(precision);
                     precision = 0;
                }
                pos += afterpos;
            } catch (invalid_argument& e) {
                throw std::runtime_error("Expected precision value in sprintf");
                (void)e;
            }
            if (fmt[pos] == 'x' || fmt[pos] == 'X') {
                oss << hex;
                if (alternateForm) oss << showbase;
            }
            // Having another function call sucks. See streamout for the reason.
            streamout(oss, value, precision);
            return sprintf(oss, fmt.substr(++pos), args...);
        }
        oss << fmt[pos];
    }
    throw std::runtime_error("extra arguments provided to sprintf");
}